

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O0

bool __thiscall
irr::gui::CGUIImageList::createImageList
          (CGUIImageList *this,ITexture *texture,dimension2d<int> imageSize,bool useAlphaChannel)

{
  int iVar1;
  dimension2d<unsigned_int> *pdVar2;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (in_RSI != 0) {
    *(long *)(in_RDI + 0x10) = in_RSI;
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)(in_RDI + 0x10) + *(long *)(**(long **)(in_RDI + 0x10) + -0x18)));
    *(undefined8 *)(in_RDI + 0x1c) = in_RDX;
    pdVar2 = video::ITexture::getSize(*(ITexture **)(in_RDI + 0x10));
    *(uint *)(in_RDI + 0x24) = pdVar2->Width / *(uint *)(in_RDI + 0x1c);
    iVar1 = *(int *)(in_RDI + 0x24);
    pdVar2 = video::ITexture::getSize(*(ITexture **)(in_RDI + 0x10));
    *(uint *)(in_RDI + 0x18) = (iVar1 * pdVar2->Height) / *(uint *)(in_RDI + 0x20);
    *(byte *)(in_RDI + 0x28) = in_CL & 1;
  }
  return in_RSI != 0;
}

Assistant:

bool CGUIImageList::createImageList(video::ITexture *texture,
		core::dimension2d<s32> imageSize,
		bool useAlphaChannel)
{
	if (!texture) {
		return false;
	}

	Texture = texture;
	Texture->grab();

	ImageSize = imageSize;

	ImagesPerRow = Texture->getSize().Width / ImageSize.Width;
	ImageCount = ImagesPerRow * Texture->getSize().Height / ImageSize.Height;

	UseAlphaChannel = useAlphaChannel;

	return true;
}